

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O3

Quaternion QuaternionNormalize(Quaternion q)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Quaternion QVar7;
  
  fVar2 = q.x;
  fVar3 = q.y;
  fVar4 = q.z;
  fVar6 = q.w;
  fVar5 = SQRT(fVar6 * fVar6 + fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3);
  uVar1 = -(uint)(fVar5 == 0.0);
  fVar5 = (float)(uVar1 & 0x3f800000 | ~uVar1 & (uint)(1.0 / fVar5));
  QVar7.x = fVar2 * fVar5;
  QVar7.y = fVar3 * fVar5;
  QVar7.w = fVar6 * fVar5;
  QVar7.z = fVar4 * fVar5;
  return QVar7;
}

Assistant:

RMDEF Quaternion QuaternionNormalize(Quaternion q)
{
    Quaternion result = { 0 };

    float length, ilength;
    length = QuaternionLength(q);
    if (length == 0.0f) length = 1.0f;
    ilength = 1.0f/length;

    result.x = q.x*ilength;
    result.y = q.y*ilength;
    result.z = q.z*ilength;
    result.w = q.w*ilength;

    return result;
}